

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O0

void __thiscall
rapidjson::internal::Stack<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::Resize
          (Stack<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *this,size_t newCapacity)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *this_00;
  size_t sVar1;
  size_t originalSize;
  char *pcVar2;
  size_t size;
  size_t newCapacity_local;
  Stack<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *this_local;
  
  sVar1 = GetSize(this);
  this_00 = this->allocator_;
  pcVar2 = this->stack_;
  originalSize = GetCapacity(this);
  pcVar2 = (char *)MemoryPoolAllocator<rapidjson::CrtAllocator>::Realloc
                             (this_00,pcVar2,originalSize,newCapacity);
  this->stack_ = pcVar2;
  this->stackTop_ = this->stack_ + sVar1;
  this->stackEnd_ = this->stack_ + newCapacity;
  return;
}

Assistant:

void Resize(size_t newCapacity) {
        const size_t size = GetSize();  // Backup the current size
        stack_ = static_cast<char*>(allocator_->Realloc(stack_, GetCapacity(), newCapacity));
        stackTop_ = stack_ + size;
        stackEnd_ = stack_ + newCapacity;
    }